

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::remove_outer(string *str,char key)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  char in_SIL;
  string *in_RDI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  string *this;
  undefined4 in_stack_ffffffffffffffb8;
  undefined8 local_28;
  undefined8 local_18;
  
  uVar2 = ::std::__cxx11::string::length();
  if ((1 < uVar2) && (pcVar3 = (char *)::std::__cxx11::string::front(), *pcVar3 == in_SIL)) {
    pcVar3 = (char *)::std::__cxx11::string::front();
    iVar1 = (int)*pcVar3;
    pcVar3 = (char *)::std::__cxx11::string::back();
    if (iVar1 == *pcVar3) {
      ::std::__cxx11::string::pop_back();
      this = in_RDI;
      ::std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,in_stack_ffffffffffffffa8);
      ::std::__cxx11::string::begin();
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),(difference_type)this);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,in_stack_ffffffffffffffa8);
      ::std::__cxx11::string::erase(this,local_18,local_28);
    }
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string &remove_outer(std::string &str, char key) {
    if(str.length() > 1 && (str.front() == key)) {
        if(str.front() == str.back()) {
            str.pop_back();
            str.erase(str.begin(), str.begin() + 1);
        }
    }
    return str;
}